

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::UnlockedPoolAllocator::UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  size_t *psVar1;
  void *pvVar2;
  UnlockedPoolAllocatorPrivate *in_RDI;
  
  *(_func_int ***)in_RDI = (_func_int **)0x0;
  Allocator::Allocator((Allocator *)in_RDI);
  *(undefined ***)in_RDI = &PTR__UnlockedPoolAllocator_020114f8;
  psVar1 = &in_RDI->size_drop_threshold;
  pvVar2 = operator_new(0x40);
  UnlockedPoolAllocatorPrivate::UnlockedPoolAllocatorPrivate(in_RDI);
  *psVar1 = (size_t)pvVar2;
  *(undefined4 *)in_RDI->size_drop_threshold = 0;
  *(undefined8 *)(in_RDI->size_drop_threshold + 8) = 10;
  return;
}

Assistant:

UnlockedPoolAllocator::UnlockedPoolAllocator()
    : Allocator(), d(new UnlockedPoolAllocatorPrivate)
{
    d->size_compare_ratio = 0;
    d->size_drop_threshold = 10;
}